

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_gtar.c
# Opt level: O3

void test_compat_gtar(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *paVar4;
  char *pcVar5;
  time_t tVar6;
  la_int64_t lVar7;
  archive_entry *ae;
  char name [23];
  archive_entry *local_50;
  char local_48 [24];
  
  builtin_strncpy(local_48,"test_compat_gtar_1.tar",0x17);
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                   ,L'/',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                      ,L'0',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_support_format_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  extract_reference_file(local_48);
  wVar2 = archive_read_open_filename(paVar4,local_48,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                      ,L'3',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                      ,L'6',0,"ARCHIVE_OK",(long)iVar1,"r = archive_read_next_header(a, &ae)",paVar4
                     );
  if (iVar1 == 0) {
    pcVar5 = archive_entry_pathname(local_50);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
               ,L'@',
               "12345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
               ,
               "\"12345678901234567890123456789012345678901234567890\" \"12345678901234567890123456789012345678901234567890\" \"12345678901234567890123456789012345678901234567890\" \"12345678901234567890123456789012345678901234567890\""
               ,pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    tVar6 = archive_entry_mtime(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'A',0x475b807b,"1197179003",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
    lVar7 = archive_entry_uid(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'B',1000,"1000",lVar7,"archive_entry_uid(ae)",(void *)0x0);
    pcVar5 = archive_entry_uname(local_50);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
               ,L'C',"tim","\"tim\"",pcVar5,"archive_entry_uname(ae)",(void *)0x0,L'\0');
    lVar7 = archive_entry_gid(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'D',1000,"1000",lVar7,"archive_entry_gid(ae)",(void *)0x0);
    pcVar5 = archive_entry_gname(local_50);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
               ,L'E',"tim","\"tim\"",pcVar5,"archive_entry_gname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_mode(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'F',0x81a4,"0100644",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paVar4,&local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'I',0,"ARCHIVE_OK",(long)iVar1,"r = archive_read_next_header(a, &ae)",
                        paVar4);
    if (iVar1 == 0) {
      pcVar5 = archive_entry_pathname(local_50);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                 ,L'S',
                 "abcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghijabcdefghij"
                 ,
                 "\"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghij\" \"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghij\" \"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghij\" \"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghij\""
                 ,pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      pcVar5 = archive_entry_symlink(local_50);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                 ,L'Y',
                 "12345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890123456789012345678901234567890"
                 ,
                 "\"12345678901234567890123456789012345678901234567890\" \"12345678901234567890123456789012345678901234567890\" \"12345678901234567890123456789012345678901234567890\" \"12345678901234567890123456789012345678901234567890\""
                 ,pcVar5,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
      tVar6 = archive_entry_mtime(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                          ,L'Z',0x475b80a3,"1197179043",tVar6,"archive_entry_mtime(ae)",(void *)0x0)
      ;
      lVar7 = archive_entry_uid(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                          ,L'[',1000,"1000",lVar7,"archive_entry_uid(ae)",(void *)0x0);
      pcVar5 = archive_entry_uname(local_50);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                 ,L'\\',"tim","\"tim\"",pcVar5,"archive_entry_uname(ae)",(void *)0x0,L'\0');
      lVar7 = archive_entry_gid(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                          ,L']',1000,"1000",lVar7,"archive_entry_gid(ae)",(void *)0x0);
      pcVar5 = archive_entry_gname(local_50);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                 ,L'^',"tim","\"tim\"",pcVar5,"archive_entry_gname(ae)",(void *)0x0,L'\0');
      mVar3 = archive_entry_mode(local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                          ,L'_',0xa1ed,"0120755",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
      iVar1 = archive_read_next_header((archive *)paVar4,&local_50);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                          ,L'b',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar4);
      iVar1 = archive_filter_code((archive *)paVar4,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                          ,L'e',(long)iVar1,"archive_filter_code(a, 0)",0,"ARCHIVE_FILTER_NONE",
                          (void *)0x0);
      iVar1 = archive_format((archive *)paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                          ,L'f',(long)iVar1,"archive_format(a)",0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR",
                          (void *)0x0);
      iVar1 = archive_read_close((archive *)paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                          ,L'h',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
      iVar1 = archive_read_free((archive *)paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                          ,L'i',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      goto LAB_0013544d;
    }
  }
  archive_read_free((archive *)paVar4);
LAB_0013544d:
  builtin_strncpy(local_48,"test_compat_gtar_2.tar",0x17);
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                   ,L'x',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                      ,L'y',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4);
  iVar1 = archive_read_support_format_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                      ,L'z',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar4);
  extract_reference_file(local_48);
  wVar2 = archive_read_open_filename(paVar4,local_48,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                      ,L'|',0,"ARCHIVE_OK",(long)wVar2,"archive_read_open_filename(a, name, 10240)",
                      paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                      ,L'\x7f',0,"ARCHIVE_OK",(long)iVar1,"r = archive_read_next_header(a, &ae)",
                      paVar4);
  if (iVar1 == 0) {
    lVar7 = archive_entry_uid(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'\x86',0x200000,"2097152",lVar7,"archive_entry_uid(ae)",(void *)0x0);
    lVar7 = archive_entry_gid(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'\x87',0x200000,"2097152",lVar7,"archive_entry_gid(ae)",(void *)0x0);
    iVar1 = archive_read_next_header((archive *)paVar4,&local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'\x8a',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                        paVar4);
    iVar1 = archive_filter_code((archive *)paVar4,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'\x8d',(long)iVar1,"archive_filter_code(a, 0)",0,"ARCHIVE_FILTER_NONE",
                        (void *)0x0);
    iVar1 = archive_format((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'\x8e',(long)iVar1,"archive_format(a)",0x30004,"ARCHIVE_FORMAT_TAR_GNUTAR"
                        ,(void *)0x0);
    iVar1 = archive_read_close((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'\x90',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free((archive *)paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_compat_gtar.c"
                        ,L'\x91',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  }
  else {
    archive_read_free((archive *)paVar4);
  }
  return;
}

Assistant:

static void
test_compat_gtar_1(void)
{
	char name[] = "test_compat_gtar_1.tar";
	struct archive_entry *ae;
	struct archive *a;
	int r;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 10240));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, r = archive_read_next_header(a, &ae));
	if (r != ARCHIVE_OK) {
		archive_read_free(a);
		return;
	}
	assertEqualString(
		"12345678901234567890123456789012345678901234567890"
		"12345678901234567890123456789012345678901234567890"
		"12345678901234567890123456789012345678901234567890"
		"12345678901234567890123456789012345678901234567890",
		archive_entry_pathname(ae));
	assertEqualInt(1197179003, archive_entry_mtime(ae));
	assertEqualInt(1000, archive_entry_uid(ae));
	assertEqualString("tim", archive_entry_uname(ae));
	assertEqualInt(1000, archive_entry_gid(ae));
	assertEqualString("tim", archive_entry_gname(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));

	/* Read second entry. */
	assertEqualIntA(a, ARCHIVE_OK, r = archive_read_next_header(a, &ae));
	if (r != ARCHIVE_OK) {
		archive_read_free(a);
		return;
	}
	assertEqualString(
		"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghij"
		"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghij"
		"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghij"
		"abcdefghijabcdefghijabcdefghijabcdefghijabcdefghij",
		archive_entry_pathname(ae));
	assertEqualString(
		"12345678901234567890123456789012345678901234567890"
		"12345678901234567890123456789012345678901234567890"
		"12345678901234567890123456789012345678901234567890"
		"12345678901234567890123456789012345678901234567890",
		archive_entry_symlink(ae));
	assertEqualInt(1197179043, archive_entry_mtime(ae));
	assertEqualInt(1000, archive_entry_uid(ae));
	assertEqualString("tim", archive_entry_uname(ae));
	assertEqualInt(1000, archive_entry_gid(ae));
	assertEqualString("tim", archive_entry_gname(ae));
	assertEqualInt(0120755, archive_entry_mode(ae));

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_NONE);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_GNUTAR);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}